

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

shared_ptr<gui::TextBoxStyle> __thiscall gui::DefaultTheme::makeTextBoxStyle(DefaultTheme *this)

{
  float fVar1;
  uint uVar2;
  element_type *this_00;
  element_type *padding;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Gui *in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::TextBoxStyle> sVar3;
  shared_ptr<gui::TextBoxStyle> *style;
  Font *in_stack_ffffffffffffff88;
  TextBoxStyle *in_stack_ffffffffffffff90;
  Vector3<float> local_38;
  Vector2<float> local_2c [3];
  undefined1 local_11;
  
  local_11 = 0;
  std::make_shared<gui::TextBoxStyle,gui::Gui_const&>(in_RSI);
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22242d);
  TextBoxStyle::setFillColor(in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x222448);
  TextBoxStyle::setOutlineColor(in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x222463);
  TextBoxStyle::setOutlineThickness
            (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x22247f);
  std::unique_ptr<sf::Font,_void_(*)(sf::Font_*)>::operator*
            ((unique_ptr<sf::Font,_void_(*)(sf::Font_*)> *)in_stack_ffffffffffffff90);
  TextBoxStyle::setFont(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2224b4);
  TextBoxStyle::setCharacterSize
            (in_stack_ffffffffffffff90,(uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2224cd);
  TextBoxStyle::setTextFillColor(in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2224e8);
  TextBoxStyle::setReadOnlyFillColor(in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x222503);
  TextBoxStyle::setDefaultTextFillColor
            (in_stack_ffffffffffffff90,(Color *)in_stack_ffffffffffffff88);
  this_00 = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x22251e);
  fVar1 = *(float *)&(in_RSI->onWindowResized).callbacks_._M_t._M_impl.super__Rb_tree_header.
                     _M_header._M_right;
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x222540);
  uVar2 = TextBoxStyle::getCharacterSize((TextBoxStyle *)0x222548);
  sf::Vector2<float>::Vector2(local_2c,2.0,fVar1 * (float)uVar2);
  TextBoxStyle::setCaretSize(this_00,(Vector2f *)in_stack_ffffffffffffff88);
  std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x222592);
  TextBoxStyle::setCaretFillColor(this_00,(Color *)in_stack_ffffffffffffff88);
  padding = std::__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2225ad);
  sf::Vector3<float>::Vector3
            (&local_38,8.0,1.0,
             *(float *)&(in_RSI->onWindowResized).callbacks_._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_right);
  TextBoxStyle::setTextPadding(this_00,(Vector3f *)padding);
  sVar3.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::TextBoxStyle>)
         sVar3.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextBoxStyle> DefaultTheme::makeTextBoxStyle() const {
    auto style = std::make_shared<TextBoxStyle>(gui_);
    style->setFillColor(sf::Color::White);
    style->setOutlineColor(colorGray);
    style->setOutlineThickness(-1.0f);

    style->setFont(*font_);
    style->setCharacterSize(15);
    style->setTextFillColor(sf::Color::Black);

    style->setReadOnlyFillColor(colorLightGray2);
    style->setDefaultTextFillColor(colorGray3);
    style->setCaretSize({2.0f, fontMaxHeightRatio_ * style->getCharacterSize()});
    style->setCaretFillColor(colorDarkBlue);
    style->setTextPadding({8.0f, 1.0f, fontMaxHeightRatio_});

    return style;
}